

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O1

void __thiscall ui::LedPanel::LedPanel(LedPanel *this)

{
  pointer pcVar1;
  ComponentBase *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  LedPanel *this_02;
  pointer pbVar2;
  long lVar3;
  ConstStringListRef entries;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  undefined1 local_199;
  LedPanel *local_198;
  Led *local_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_188;
  value_type local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_160;
  Component local_158;
  Component local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_120;
  Components local_108;
  undefined4 *local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  uint uStack_d4;
  undefined4 *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  uint uStack_b4;
  code *local_a8;
  undefined8 uStack_a0;
  code *local_98;
  code *pcStack_90;
  code *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  code *local_58;
  code *local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  (this->super_PanelBase).super_ComponentBase.children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PanelBase).super_ComponentBase.parent_ = (ComponentBase *)0x0;
  (this->super_PanelBase).super_ComponentBase.children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PanelBase).super_ComponentBase.children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PanelBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__LedPanel_001744a0;
  this->selected_led_ = 0;
  local_160 = &this->names_;
  (this->names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  entries.ref_ = &this->radiobox_;
  local_d8 = 0x208997e2;
  local_e0 = 4;
  uStack_d4 = uStack_d4 & 0xffffff00;
  local_b8 = 0x208b97e2;
  local_c0 = 4;
  uStack_b4 = uStack_b4 & 0xffffff00;
  uStack_a0 = 0;
  local_a8 = ftxui::inverted;
  pcStack_90 = std::
               _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  uStack_80 = 0;
  local_88 = ftxui::nothing;
  pcStack_70 = std::
               _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  local_68 = 0;
  uStack_60 = 0;
  local_50 = std::
             _Function_handler<void_(),_ftxui::RadioboxOption::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/include/ftxui/component/component_options.hpp:70:37)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_ftxui::RadioboxOption::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/include/ftxui/component/component_options.hpp:70:37)>
             ::_M_manager;
  local_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  entries.ref_wide_ =
       (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        *)local_160;
  local_198 = this;
  local_e8 = &local_d8;
  local_c8 = &local_b8;
  ftxui::Radiobox(entries,(int *)0x0,(Ref<ftxui::RadioboxOption> *)&this->selected_led_);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT44(uStack_b4,local_b8) + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,CONCAT44(uStack_d4,local_d8) + 1);
  }
  local_108.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ftxui::Container::Tab((Container *)&this->led_tab_,&local_108,&this->selected_led_);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_108);
  FindLEDs_abi_cxx11_();
  if (local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar2 = local_138.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar1 = (pbVar2->_M_dataplus)._M_p;
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_180,pcVar1,pcVar1 + pbVar2->_M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_160,&local_180);
      this_00 = (this->led_tab_).
                super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_190 = (Led *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<ui::Led,std::allocator<ui::Led>,std::__cxx11::string&>
                (&_Stack_188,&local_190,(allocator<ui::Led> *)&local_199,&local_180);
      local_148.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_190->super_ComponentBase;
      local_148.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Stack_188._M_pi;
      local_190 = (Led *)0x0;
      _Stack_188._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ftxui::ComponentBase::Add(this_00,&local_148);
      if (local_148.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_148.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (_Stack_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_188._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != local_138.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  this_02 = local_198;
  local_180._M_dataplus._M_p =
       (pointer)(local_198->radiobox_).
                super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_180._M_string_length =
       (size_type)
       (local_198->radiobox_).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_string_length)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_string_length)->
           _M_use_count + 1;
    }
  }
  local_180.field_2._M_allocated_capacity =
       (size_type)
       (local_198->led_tab_).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_180.field_2._8_8_ =
       (local_198->led_tab_).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.field_2._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.field_2._8_8_)->_M_use_count +
           1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.field_2._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.field_2._8_8_)->_M_use_count +
           1;
    }
  }
  __l._M_len = 2;
  __l._M_array = (iterator)&local_180;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_120,__l,(allocator_type *)&local_138);
  ftxui::Container::Vertical((Container *)&local_158,&local_120);
  ftxui::ComponentBase::Add((ComponentBase *)this_02,&local_158);
  if (local_158.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_120);
  lVar3 = 0x20;
  do {
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&_Stack_188._M_pi + lVar3);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != 0);
  return;
}

Assistant:

LedPanel() {
    for (auto name : FindLEDs()) {
      names_.push_back(name);
      led_tab_->Add(Make<Led>(name));
    }

    Add(Container::Vertical({
        radiobox_,
        led_tab_,
    }));
  }